

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::ValidationState_t::CooperativeVectorDimensionsMatch
          (ValidationState_t *this,Instruction *inst,uint32_t v1,uint32_t v2)

{
  Op OVar1;
  Op OVar2;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_440;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_268;
  tuple<bool,_bool,_unsigned_int> local_250;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_248;
  tuple<bool,_bool,_unsigned_int> local_22c;
  uint local_224;
  uint local_220;
  uint32_t v2_value;
  uint32_t v1_value;
  bool v2_is_const_int32;
  bool v2_is_int32;
  bool v1_is_const_int32;
  bool v1_is_int32;
  uint32_t v2_components_id;
  uint32_t v1_components_id;
  Instruction *local_38;
  Instruction *v2_type;
  Instruction *v1_type;
  uint32_t v2_local;
  uint32_t v1_local;
  Instruction *inst_local;
  ValidationState_t *this_local;
  
  v1_type._0_4_ = v2;
  v1_type._4_4_ = v1;
  _v2_local = inst;
  inst_local = (Instruction *)this;
  v2_type = FindDef(this,v1);
  local_38 = FindDef(this,(uint32_t)v1_type);
  OVar1 = val::Instruction::opcode(v2_type);
  OVar2 = val::Instruction::opcode(local_38);
  if (OVar1 == OVar2) {
    _v2_is_const_int32 = val::Instruction::GetOperandAs<unsigned_int>(v2_type,2);
    v1_value = val::Instruction::GetOperandAs<unsigned_int>(local_38,2);
    v2_value._3_1_ = 0;
    v2_value._2_1_ = 0;
    v2_value._1_1_ = 0;
    v2_value._0_1_ = 0;
    local_220 = 0;
    local_224 = 0;
    EvalInt32IfConst(&local_22c,this,_v2_is_const_int32);
    std::tie<bool,bool,unsigned_int>
              (&local_248,(bool *)((long)&v2_value + 3),(bool *)((long)&v2_value + 2),&local_220);
    std::tuple<bool&,bool&,unsigned_int&>::operator=
              ((tuple<bool&,bool&,unsigned_int&> *)&local_248,&local_22c);
    EvalInt32IfConst(&local_250,this,v1_value);
    std::tie<bool,bool,unsigned_int>
              (&local_268,(bool *)((long)&v2_value + 1),(bool *)&v2_value,&local_224);
    std::tuple<bool&,bool&,unsigned_int&>::operator=
              ((tuple<bool&,bool&,unsigned_int&> *)&local_268,&local_250);
    if ((((v2_value._2_1_ & 1) == 0) || (((byte)v2_value & 1) == 0)) || (local_220 == local_224)) {
      this_local._4_4_ = SPV_SUCCESS;
    }
    else {
      diag(&local_440,this,SPV_ERROR_INVALID_DATA,_v2_local);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_440,(char (*) [46])"Expected number of components to be identical")
      ;
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_440);
    }
  }
  else {
    diag((DiagnosticStream *)&v2_components_id,this,SPV_ERROR_INVALID_DATA,_v2_local);
    pDVar3 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&v2_components_id,
                        (char (*) [34])"Expected cooperative vector types");
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&v2_components_id);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t ValidationState_t::CooperativeVectorDimensionsMatch(
    const Instruction* inst, uint32_t v1, uint32_t v2) {
  const auto v1_type = FindDef(v1);
  const auto v2_type = FindDef(v2);

  if (v1_type->opcode() != v2_type->opcode()) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected cooperative vector types";
  }

  uint32_t v1_components_id = v1_type->GetOperandAs<uint32_t>(2);
  uint32_t v2_components_id = v2_type->GetOperandAs<uint32_t>(2);

  bool v1_is_int32 = false, v1_is_const_int32 = false, v2_is_int32 = false,
       v2_is_const_int32 = false;
  uint32_t v1_value = 0, v2_value = 0;

  std::tie(v1_is_int32, v1_is_const_int32, v1_value) =
      EvalInt32IfConst(v1_components_id);
  std::tie(v2_is_int32, v2_is_const_int32, v2_value) =
      EvalInt32IfConst(v2_components_id);

  if (v1_is_const_int32 && v2_is_const_int32 && v1_value != v2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected number of components to be identical";
  }

  return SPV_SUCCESS;
}